

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.hpp
# Opt level: O1

void __thiscall
libtorrent::aux::session_impl::send_udp_packet_hostname_listen
          (session_impl *this,listen_socket_handle *sock,char *hostname,int port,span<const_char> p,
          error_code *ec,udp_send_flags_t flags)

{
  int *piVar1;
  _Atomic_word *p_Var2;
  int iVar3;
  listen_socket_t *plVar4;
  span<const_char> p_00;
  __weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2> local_58;
  difference_type local_48;
  __weak_ptr<libtorrent::aux::utp_socket_interface,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  long *local_38;
  
  local_48 = p.m_len;
  p_00.m_ptr = p.m_ptr;
  plVar4 = listen_socket_handle::get(sock);
  if (plVar4 == (listen_socket_t *)0x0) {
    ec->val_ = 9;
    ec->failed_ = true;
    *(undefined3 *)&ec->field_0x5 = 0;
    ec->cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
                super_error_category;
  }
  else {
    local_58._M_ptr =
         (sock->m_sock).
         super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_58._M_refcount._M_pi =
         (sock->m_sock).
         super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (local_58._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_58._M_refcount._M_pi)->_M_weak_count =
             (local_58._M_refcount._M_pi)->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        (local_58._M_refcount._M_pi)->_M_weak_count =
             (local_58._M_refcount._M_pi)->_M_weak_count + 1;
      }
    }
    ::std::__weak_ptr<libtorrent::aux::utp_socket_interface,(__gnu_cxx::_Lock_policy)2>::
    __weak_ptr<libtorrent::aux::listen_socket_t,void>(local_40,&local_58);
    p_00.m_len = local_48;
    send_udp_packet_hostname
              (this,(weak_ptr<libtorrent::aux::utp_socket_interface> *)local_40,hostname,port,p_00,
               ec,flags);
    if (local_38 != (long *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)((long)local_38 + 0xc);
        iVar3 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
      }
      else {
        iVar3 = *(int *)((long)local_38 + 0xc);
        *(int *)((long)local_38 + 0xc) = iVar3 + -1;
      }
      if (iVar3 == 1) {
        (**(code **)(*local_38 + 0x18))();
      }
    }
    if (local_58._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2 = &(local_58._M_refcount._M_pi)->_M_weak_count;
        iVar3 = *p_Var2;
        *p_Var2 = *p_Var2 + -1;
        UNLOCK();
      }
      else {
        iVar3 = (local_58._M_refcount._M_pi)->_M_weak_count;
        (local_58._M_refcount._M_pi)->_M_weak_count = iVar3 + -1;
      }
      if (iVar3 == 1) {
        (*(local_58._M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
      }
    }
  }
  return;
}

Assistant:

void send_udp_packet_hostname_listen(aux::listen_socket_handle const& sock
				, char const* hostname
				, int port
				, span<char const> p
				, error_code& ec
				, udp_send_flags_t const flags)
			{
				listen_socket_t* s = sock.get();
				if (!s)
				{
					ec = boost::asio::error::bad_descriptor;
					return;
				}
				send_udp_packet_hostname(sock.get_ptr(), hostname, port, p, ec, flags);
			}